

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O3

Number __thiscall rc::Random::next(Random *this)

{
  ulong uVar1;
  Counter CVar2;
  ulong uVar3;
  
  uVar1 = this->m_counter;
  uVar3 = uVar1 & 3;
  if (uVar3 == 0) {
    mash(this,&this->m_block);
    uVar1 = this->m_counter;
  }
  if (uVar1 == 0xffffffffffffffff) {
    append(this,true);
    CVar2 = 0;
  }
  else {
    CVar2 = uVar1 + 1;
  }
  this->m_counter = CVar2;
  return (this->m_block)._M_elems[uVar3];
}

Assistant:

Random::Number Random::next() {
  std::size_t blki = m_counter % std::tuple_size<Block>::value;
  if (blki == 0) {
    mash(m_block);
  }

  if (m_counter == kCounterMax) {
    append(true);
    m_counter = 0;
  } else {
    m_counter++;
  }

  return m_block[blki];
}